

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_makeArray
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,size_t elementCount,
               int16_t *elementOperands)

{
  int32_t iVar1;
  sysbvm_x86_register_t extraout_EDX;
  sysbvm_x86_register_t extraout_EDX_00;
  sysbvm_x86_register_t reg;
  size_t sVar2;
  int offset;
  uint8_t local_36 [4];
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  uint8_t local_2f [4];
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  if (-1 < resultOperand) {
    iVar1 = jit->contextPointerOffset;
    local_36[0] = 'H';
    local_36[1] = 0x8b;
    local_36[2] = 0xbd;
    local_36[3] = (uint8_t)iVar1;
    local_32 = (undefined1)((uint)iVar1 >> 8);
    local_31 = (undefined1)((uint)iVar1 >> 0x10);
    local_30 = (undefined1)((uint)iVar1 >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,7,local_36);
    local_2f[0] = 'H';
    local_2f[1] = 199;
    local_2f[2] = 0xc6;
    local_2f[3] = (uint8_t)elementCount;
    local_2b = (undefined1)(elementCount >> 8);
    local_2a = (undefined1)(elementCount >> 0x10);
    local_29 = (undefined1)(elementCount >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,7,local_2f);
    sysbvm_jit_x86_call(jit,sysbvm_array_create);
    reg = extraout_EDX;
    if (elementCount != 0) {
      offset = 0x10;
      sVar2 = 0;
      do {
        sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,elementOperands[sVar2]);
        sysbvm_jit_x86_mov64IntoMemoryWithOffset
                  (jit,SYSBVM_X86_64_CALL_SHADOW_SPACE,offset,SYSBVM_X86_64_ARG2);
        sVar2 = sVar2 + 1;
        offset = offset + 8;
        reg = extraout_EDX_00;
      } while (elementCount != sVar2);
    }
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeArray(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, size_t elementCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG1, (int32_t)elementCount);
    sysbvm_jit_x86_call(jit, &sysbvm_array_create);

    for(size_t i = 0; i < elementCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, elementOperands[i]);
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RAX, (int32_t)(sizeof(sysbvm_tuple_header_t) + i * sizeof(void*)), SYSBVM_X86_64_ARG2);
    }

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}